

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaFalse.c
# Opt level: O1

Gia_Man_t *
Gia_ManCheckFalseAll(Gia_Man_t *p,int nSlackMax,int nTimeOut,int fVerbose,int fVeryVerbose)

{
  uint uVar1;
  int iVar2;
  Gia_Man_t *p_00;
  Gia_Man_t *p_01;
  ulong uVar3;
  uint uVar4;
  uint uVar5;
  long lVar6;
  long lVar7;
  bool bVar8;
  uint local_44;
  
  p_00 = Gia_ManDup(p);
  local_44 = 0;
  uVar4 = 0;
  do {
    Gia_ManLevelNum(p_00);
    uVar3 = (ulong)(uint)p_00->nObjs;
    uVar5 = uVar4;
    if (0 < p_00->nObjs) {
      lVar7 = 0;
      lVar6 = 0;
      do {
        if (p_00->pObjs == (Gia_Obj_t *)0x0) break;
        uVar1 = *(uint *)(&p_00->pObjs->field_0x0 + lVar7);
        if ((~uVar1 & 0x1fffffff) != 0 && -1 < (int)uVar1) {
          if ((int)uVar3 <= lVar6) {
            __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                          ,0x1d9,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
          }
          iVar2 = Gia_ObjLevelId(p_00,(int)lVar6);
          if (iVar2 <= nSlackMax) {
            local_44 = local_44 + 1;
            p_01 = Gia_ManCheckOne(p_00,-1,(int)lVar6,nTimeOut,fVerbose,fVeryVerbose);
            if (p_01 != (Gia_Man_t *)0x0) {
              uVar5 = uVar5 + 1;
              Gia_ManStop(p_00);
              Gia_ManLevelNum(p_01);
              p_00 = p_01;
            }
          }
        }
        lVar6 = lVar6 + 1;
        uVar3 = (ulong)p_00->nObjs;
        lVar7 = lVar7 + 0xc;
      } while (lVar6 < (long)uVar3);
    }
    bVar8 = uVar4 == uVar5;
    uVar4 = uVar5;
    if (bVar8) {
      printf("Performed %d attempts and %d changes.\n",(ulong)local_44,(ulong)uVar5);
      return p_00;
    }
  } while( true );
}

Assistant:

Gia_Man_t * Gia_ManCheckFalseAll( Gia_Man_t * p, int nSlackMax, int nTimeOut, int fVerbose, int fVeryVerbose )
{
    int Tried = 0, Changed = 0;
    p = Gia_ManDup( p );
    while ( 1 )
    {
        Gia_Man_t * pNew;
        Gia_Obj_t * pObj;
        int i, LevelMax, Changed0 = Changed;
        LevelMax = Gia_ManLevelNum( p );
        Gia_ManForEachAnd( p, pObj, i )
        {
            if ( Gia_ObjLevel(p, pObj) > nSlackMax )
                continue;
            Tried++;
            pNew = Gia_ManCheckOne( p, -1, i, nTimeOut, fVerbose, fVeryVerbose );
            if ( pNew == NULL )
                continue;
            Changed++;
            Gia_ManStop( p );
            p = pNew;
            LevelMax = Gia_ManLevelNum( p );
        }
        if ( Changed0 == Changed )
            break;
    }
//    if ( fVerbose )
        printf( "Performed %d attempts and %d changes.\n", Tried, Changed );
    return p;
}